

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_file.cpp
# Opt level: O2

void just_test_test_case_f_test_throws_when_fails_to_open_file_for_read(void)

{
  size_t __nbytes;
  allocator<char> local_71;
  assert_msg local_70;
  allocator<char> local_48 [32];
  _Vector_base<char,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"/proc/asd",local_48);
  just::file::read((int)&local_28,&local_70,__nbytes);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_28);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/file/test/test_file.cpp"
             ,&local_71);
  std::__cxx11::string::string((string *)&local_70,(string *)local_48);
  local_70._line = 0x49;
  just::test::assert_msg::operator()(&local_70,false);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

JUST_TEST_CASE(test_throws_when_fails_to_open_file_for_read)
{
  try
  {
    just::file::read("/proc/asd");
    JUST_ASSERT(!"The above should have thrown");
  }
  catch (const just::file::error&)
  {
    // ignore
  }
}